

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O2

void sdefl_fnd(sdefl_match *m,sdefl *s,int chain_len,int max_match,uchar *in,int p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  
  piVar7 = s->tbl + ((uint)(*(int *)(in + p) * -0x61c88677) >> 0x11);
  iVar4 = 0x7fff;
  if (0x7fff < p) {
    iVar4 = p;
  }
  uVar3 = 4;
  if (4 < max_match) {
    uVar3 = max_match;
  }
  do {
    uVar1 = *piVar7;
    if ((int)uVar1 <= iVar4 + -0x8000) {
      return;
    }
    iVar2 = m->len;
    if ((in[(int)(iVar2 + uVar1)] == in[iVar2 + p]) &&
       (*(int *)(in + (int)uVar1) == *(int *)(in + p))) {
      for (uVar6 = 4; (long)uVar6 < (long)max_match; uVar6 = uVar6 + 1) {
        if (in[uVar6 + (long)(int)uVar1] != in[uVar6 + (long)p]) goto LAB_001201a9;
      }
      uVar6 = (ulong)uVar3;
LAB_001201a9:
      iVar5 = (int)uVar6;
      if (iVar2 < iVar5) {
        m->len = iVar5;
        m->off = p - uVar1;
        if (iVar5 == max_match) {
          return;
        }
      }
    }
    chain_len = chain_len + -1;
    if (chain_len == 0) {
      return;
    }
    piVar7 = s->prv + (uVar1 & 0x7fff);
  } while( true );
}

Assistant:

static void
sdefl_fnd(struct sdefl_match *m, const struct sdefl *s,
          int chain_len, int max_match, const unsigned char *in, int p) {
  int i = s->tbl[sdefl_hash32(&in[p])];
  int limit = ((p-SDEFL_WIN_SIZ)<SDEFL_NIL)?SDEFL_NIL:(p-SDEFL_WIN_SIZ);
  while (i > limit) {
    if (in[i+m->len] == in[p+m->len] &&
        (sdefl_uload32(&in[i]) == sdefl_uload32(&in[p]))){
      int n = SDEFL_MIN_MATCH;
      while (n < max_match && in[i+n] == in[p+n]) n++;
      if (n > m->len) {
        m->len = n, m->off = p - i;
        if (n == max_match) break;
      }
    }
    if (!(--chain_len)) break;
    i = s->prv[i&SDEFL_WIN_MSK];
  }
}